

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O2

void __thiscall
duckdb::StdOutLogStorage::WriteLogEntries
          (StdOutLogStorage *this,DataChunk *chunk,RegisteredLoggingContext *context)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"StdOutLogStorage::WriteLogEntries",&local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StdOutLogStorage::WriteLogEntries(DataChunk &chunk, const RegisteredLoggingContext &context) {
	throw NotImplementedException("StdOutLogStorage::WriteLogEntries");
}